

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void perfetto::ipc::HostImpl::SendFrame(ClientConnection *client,Frame *frame,int fd)

{
  uint __errnum;
  UnixSocket *this;
  code *pcVar1;
  bool bVar2;
  char *fname;
  uint *puVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  Frame *frame_00;
  Frame *extraout_RDX;
  string buf;
  int local_3c;
  string local_38;
  
  frame_00 = (Frame *)CONCAT44(in_register_00000014,fd);
  _DAT_003d6b58 =
       (ulong)((client->sock)._M_t.
               super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
               .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->peer_uid_;
  DAT_003d6b49 = 1;
  if (((anonymous_namespace)::g_crash_key_uid & 1) == 0) {
    base::CrashKey::Register((CrashKey *)&(anonymous_namespace)::g_crash_key_uid);
    frame_00 = extraout_RDX;
  }
  BufferedFrameDeserializer::Serialize_abi_cxx11_
            (&local_38,(BufferedFrameDeserializer *)frame,frame_00);
  this = (client->sock)._M_t.
         super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
         .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
  local_3c = fd;
  if (fd == -1) {
    bVar2 = base::UnixSocket::Send
                      (this,local_38._M_dataplus._M_p,local_38._M_string_length,(int *)0x0,0);
  }
  else {
    bVar2 = base::UnixSocket::Send
                      (this,local_38._M_dataplus._M_p,local_38._M_string_length,&local_3c,1);
  }
  if ((bVar2 == false) &&
     (((client->sock)._M_t.
       super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
       .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->state_ ==
      kConnected)) {
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar3 = (uint *)__errno_location();
    __errnum = *puVar3;
    pcVar4 = strerror(__errnum);
    base::LogMessage(kLogError,fname,0x112d9,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(res || !client->sock->is_connected())",(ulong)__errnum,pcVar4);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _DAT_003d6b58 = 0;
  DAT_003d6b49 = 0;
  return;
}

Assistant:

void HostImpl::SendFrame(ClientConnection* client, const Frame& frame, int fd) {
  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));

  std::string buf = BufferedFrameDeserializer::Serialize(frame);

  // When a new Client connects in OnNewClientConnection we set a timeout on
  // Send (see call to SetTxTimeout).
  //
  // The old behaviour was to do a blocking I/O call, which caused crashes from
  // misbehaving producers (see b/169051440).
  bool res = client->sock->Send(buf.data(), buf.size(), fd);
  // If we timeout |res| will be false, but the UnixSocket will have called
  // UnixSocket::ShutDown() and thus |is_connected()| is false.
  PERFETTO_CHECK(res || !client->sock->is_connected());
}